

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O2

shared_ptr<QPDFObject> __thiscall QPDF::getObjectForParser(QPDF *this,int id,int gen,bool parse_pdf)

{
  long lVar1;
  iterator iVar2;
  size_type sVar3;
  _Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_> _Var4;
  int iVar5;
  undefined7 in_register_00000009;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  undefined4 in_register_00000034;
  long *plVar7;
  char in_R8B;
  shared_ptr<QPDFObject> sVar8;
  pair<std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>,_bool> pVar9;
  QPDFObjGen og;
  QPDFObjGen in_stack_ffffffffffffff98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  pair<const_QPDFObjGen,_QPDF::ObjCache> local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  
  plVar7 = (long *)CONCAT44(in_register_00000034,id);
  iVar5 = (int)CONCAT71(in_register_00000009,parse_pdf);
  iVar2 = std::
          _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDF::ObjCache>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
          ::find((_Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDF::ObjCache>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
                  *)(*plVar7 + 0x1a8),(key_type *)&stack0xffffffffffffff90);
  if (iVar2._M_node == (_Base_ptr)(*plVar7 + 0x1b0)) {
    sVar3 = std::
            map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
            ::count((map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
                     *)(*plVar7 + 0x138),(key_type *)&stack0xffffffffffffff90);
    lVar1 = *plVar7;
    if ((sVar3 == 0) && (*(char *)(lVar1 + 0x2d4) != '\0')) {
      if (in_R8B != '\0') {
        sVar8 = QPDFObject::create<QPDF_Null>();
        _Var6 = sVar8.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        goto LAB_001e6ea1;
      }
      QPDFObject::create<QPDF_Null>((QPDF *)CONCAT44(iVar5,gen),in_stack_ffffffffffffff98);
      std::pair<const_QPDFObjGen,_QPDF::ObjCache>::
      pair<QPDFObjGen_&,_std::shared_ptr<QPDFObject>,_true>
                (&local_58,(QPDFObjGen *)&stack0xffffffffffffff90,
                 (shared_ptr<QPDFObject> *)&stack0xffffffffffffff98);
      pVar9 = std::
              _Rb_tree<QPDFObjGen,std::pair<QPDFObjGen_const,QPDF::ObjCache>,std::_Select1st<std::pair<QPDFObjGen_const,QPDF::ObjCache>>,std::less<QPDFObjGen>,std::allocator<std::pair<QPDFObjGen_const,QPDF::ObjCache>>>
              ::_M_insert_unique<std::pair<QPDFObjGen_const,QPDF::ObjCache>>
                        ((_Rb_tree<QPDFObjGen,std::pair<QPDFObjGen_const,QPDF::ObjCache>,std::_Select1st<std::pair<QPDFObjGen_const,QPDF::ObjCache>>,std::less<QPDFObjGen>,std::allocator<std::pair<QPDFObjGen_const,QPDF::ObjCache>>>
                          *)(lVar1 + 0x1a8),&local_58);
      _Var4 = pVar9.first._M_node;
    }
    else {
      QPDFObject::create<QPDF_Unresolved>((QPDF *)CONCAT44(iVar5,gen),in_stack_ffffffffffffff98);
      std::pair<const_QPDFObjGen,_QPDF::ObjCache>::
      pair<QPDFObjGen_&,_std::shared_ptr<QPDFObject>,_true>
                (&local_58,(QPDFObjGen *)&stack0xffffffffffffff90,
                 (shared_ptr<QPDFObject> *)&stack0xffffffffffffff98);
      pVar9 = std::
              _Rb_tree<QPDFObjGen,std::pair<QPDFObjGen_const,QPDF::ObjCache>,std::_Select1st<std::pair<QPDFObjGen_const,QPDF::ObjCache>>,std::less<QPDFObjGen>,std::allocator<std::pair<QPDFObjGen_const,QPDF::ObjCache>>>
              ::_M_insert_unique<std::pair<QPDFObjGen_const,QPDF::ObjCache>>
                        ((_Rb_tree<QPDFObjGen,std::pair<QPDFObjGen_const,QPDF::ObjCache>,std::_Select1st<std::pair<QPDFObjGen_const,QPDF::ObjCache>>,std::less<QPDFObjGen>,std::allocator<std::pair<QPDFObjGen_const,QPDF::ObjCache>>>
                          *)(lVar1 + 0x1a8),&local_58);
      _Var4 = pVar9.first._M_node;
    }
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&_Var4._M_node[1]._M_parent);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_58.second.object.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
    _Var6._M_pi = extraout_RDX_00;
  }
  else {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&iVar2._M_node[1]._M_parent);
    _Var6._M_pi = extraout_RDX;
  }
LAB_001e6ea1:
  sVar8.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var6._M_pi;
  sVar8.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<QPDFObject>)sVar8.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<QPDFObject>
QPDF::getObjectForParser(int id, int gen, bool parse_pdf)
{
    // This method is called by the parser and therefore must not resolve any objects.
    auto og = QPDFObjGen(id, gen);
    if (auto iter = m->obj_cache.find(og); iter != m->obj_cache.end()) {
        return iter->second.object;
    }
    if (m->xref_table.count(og) || !m->parsed) {
        return m->obj_cache.insert({og, QPDFObject::create<QPDF_Unresolved>(this, og)})
            .first->second.object;
    }
    if (parse_pdf) {
        return QPDFObject::create<QPDF_Null>();
    }
    return m->obj_cache.insert({og, QPDFObject::create<QPDF_Null>(this, og)}).first->second.object;
}